

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::OriginPubkeyProvider::OriginString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,StringType type,bool normalized)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined7 in_register_00000009;
  undefined8 uVar4;
  long in_FS_OFFSET;
  bool apostrophe;
  Span<const_unsigned_char> s;
  string local_60;
  string local_40;
  string *local_20;
  
  local_20 = *(string **)(in_FS_OFFSET + 0x28);
  if (((int)CONCAT71(in_register_00000009,normalized) != 0) ||
     (apostrophe = true, *(char *)((long)this + 0x38) == '\0')) {
    apostrophe = type == COMPAT;
  }
  s.m_size = 4;
  s.m_data = (uchar *)((long)this + 0x10);
  HexStr_abi_cxx11_(&local_40,s);
  FormatHDKeypath_abi_cxx11_
            (&local_60,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)this + 0x18),
             apostrophe);
  uVar4 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    uVar4 = local_40.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar4 < local_60._M_string_length + local_40._M_string_length) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      uVar4 = local_60.field_2._M_allocated_capacity;
    }
    if (local_60._M_string_length + local_40._M_string_length <= (ulong)uVar4) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_60,0,0,local_40._M_dataplus._M_p,local_40._M_string_length);
      goto LAB_0070512f;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_40,local_60._M_dataplus._M_p,local_60._M_string_length);
LAB_0070512f:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pbVar3->_M_dataplus)._M_p;
  paVar1 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar4 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar3->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (*(string **)(in_FS_OFFSET + 0x28) == local_20) {
    return *(string **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

std::string OriginString(StringType type, bool normalized=false) const
    {
        // If StringType==COMPAT, always use the apostrophe to stay compatible with previous versions
        bool use_apostrophe = (!normalized && m_apostrophe) || type == StringType::COMPAT;
        return HexStr(m_origin.fingerprint) + FormatHDKeypath(m_origin.path, use_apostrophe);
    }